

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d1_both.cc
# Opt level: O0

seal_result_t bssl::seal_next_record(SSL *ssl,Span<unsigned_char> out,size_t *out_len)

{
  byte bVar1;
  DTLSSentRecord t;
  unsigned_long uVar2;
  bool bVar3;
  bool bVar4;
  uint16_t uVar5;
  int iVar6;
  size_t sVar7;
  DTLSOutgoingMessage *pDVar8;
  size_t sVar9;
  uchar *puVar10;
  ulong uVar11;
  unsigned_long *puVar12;
  uint8_t *in;
  pointer this;
  size_t in_R9;
  Span<const_unsigned_char> SVar13;
  Span<const_unsigned_char> in_00;
  bool local_1f1;
  unique_ptr<bssl::MRUQueue<bssl::DTLSSentRecord,_32UL>,_bssl::internal::Deleter> local_1d8;
  Span<unsigned_char> local_1d0;
  Span<unsigned_char_const> local_1c0 [8];
  uchar *local_1b8;
  size_t local_1b0;
  size_t frag_end;
  CBB child;
  size_t frag_start;
  uchar *local_168;
  undefined1 local_160 [8];
  Span<const_unsigned_char> frag;
  size_t local_148;
  unsigned_long local_140;
  size_t todo;
  size_t capacity;
  Range range;
  Span<const_unsigned_char> body;
  uint local_108;
  hm_header_st hdr;
  CBS body_cbs;
  undefined1 local_d8 [8];
  CBS cbs;
  DTLSOutgoingMessage *msg;
  DTLSSentRecord sent_record;
  CBB cbb;
  Span<unsigned_char> fragments;
  int iStack_60;
  bool should_continue;
  bool allow_multiple_messages;
  uchar *local_58;
  DTLSRecordNumber local_50;
  DTLSRecordNumber record_number;
  size_t max_in_len;
  size_t prefix_len;
  DTLSOutgoingMessage *first_msg;
  size_t *out_len_local;
  SSL *ssl_local;
  Span<unsigned_char> out_local;
  
  out_local.data_ = (uchar *)out.size_;
  ssl_local = (SSL *)out.data_;
  *out_len = 0;
  while( true ) {
    bVar1 = ssl->d1->outgoing_written;
    sVar7 = InplaceVector<bssl::DTLSOutgoingMessage,_7UL>::size(&ssl->d1->outgoing_messages);
    local_1f1 = false;
    if (bVar1 < sVar7) {
      pDVar8 = InplaceVector<bssl::DTLSOutgoingMessage,_7UL>::operator[]
                         (&ssl->d1->outgoing_messages,(ulong)ssl->d1->outgoing_written);
      local_1f1 = DTLSOutgoingMessage::IsFullyAcked(pDVar8);
    }
    if (local_1f1 == false) break;
    ssl->d1->outgoing_offset = 0;
    ssl->d1->outgoing_written = ssl->d1->outgoing_written + '\x01';
  }
  bVar1 = ssl->d1->outgoing_written;
  sVar7 = InplaceVector<bssl::DTLSOutgoingMessage,_7UL>::size(&ssl->d1->outgoing_messages);
  if (bVar1 < sVar7) {
    pDVar8 = InplaceVector<bssl::DTLSOutgoingMessage,_7UL>::operator[]
                       (&ssl->d1->outgoing_messages,(ulong)ssl->d1->outgoing_written);
    sVar7 = dtls_seal_prefix_len(ssl,pDVar8->epoch);
    uVar5 = pDVar8->epoch;
    sVar9 = Span<unsigned_char>::size((Span<unsigned_char> *)&ssl_local);
    record_number.combined_ = dtls_seal_max_input_len(ssl,uVar5,sVar9);
    if (record_number.combined_ == 0) {
      out_local.size_._4_4_ = seal_flush;
    }
    else if ((pDVar8->is_ccs & 1U) == 0) {
      uVar5 = pDVar8->epoch;
      bVar3 = false;
      join_0x00000010_0x00000000_ =
           Span<unsigned_char>::subspan
                     ((Span<unsigned_char> *)&ssl_local,sVar7,record_number.combined_);
      puVar10 = Span<unsigned_char>::data((Span<unsigned_char> *)((long)&cbb.u + 0x18));
      sVar7 = Span<unsigned_char>::size((Span<unsigned_char> *)((long)&cbb.u + 0x18));
      CBB_init_fixed((CBB *)&sent_record.last_msg_end,puVar10,sVar7);
      DTLSSentRecord::DTLSSentRecord((DTLSSentRecord *)&msg);
      sent_record.number.combined_._0_1_ = ssl->d1->outgoing_written;
      sent_record.number.combined_._4_4_ = ssl->d1->outgoing_offset;
      do {
        bVar1 = ssl->d1->outgoing_written;
        sVar7 = InplaceVector<bssl::DTLSOutgoingMessage,_7UL>::size(&ssl->d1->outgoing_messages);
        if (sVar7 <= bVar1) goto LAB_00320d54;
        cbs.len = (size_t)InplaceVector<bssl::DTLSOutgoingMessage,_7UL>::operator[]
                                    (&ssl->d1->outgoing_messages,(ulong)ssl->d1->outgoing_written);
        if ((((DTLSOutgoingMessage *)cbs.len)->epoch != pDVar8->epoch) ||
           ((((DTLSOutgoingMessage *)cbs.len)->is_ccs & 1U) != 0)) {
          bVar3 = true;
          goto LAB_00320d54;
        }
        Span<unsigned_char_const>::Span<bssl::Array<unsigned_char>,void,bssl::Array<unsigned_char>>
                  ((Span<unsigned_char_const> *)&body_cbs.len,(Array<unsigned_char> *)cbs.len);
        cbs_st::cbs_st((cbs_st *)local_d8,stack0xffffffffffffff18);
        bVar4 = dtls1_parse_fragment
                          ((CBS *)local_d8,(hm_header_st *)((long)&body.size_ + 4),
                           (CBS *)&hdr.frag_off);
        if ((((!bVar4) || (hdr.msg_len != 0)) ||
            (uVar11 = (ulong)(uint)hdr._8_4_, sVar7 = CBS_len((CBS *)&hdr.frag_off), uVar11 != sVar7
            )) || ((sVar7 = CBS_len((CBS *)&hdr.frag_off), local_108 != sVar7 ||
                   (sVar7 = CBS_len((CBS *)local_d8), sVar7 != 0)))) {
          ERR_put_error(0x10,0,0x44,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc"
                        ,0x2ec);
          return seal_error;
        }
        join_0x00000010_0x00000000_ = cbs_st::operator_cast_to_Span((cbs_st *)&hdr.frag_off);
        while( true ) {
          _capacity = DTLSMessageBitmap::NextUnmarkedRange
                                ((DTLSMessageBitmap *)(cbs.len + 0x18),
                                 (ulong)ssl->d1->outgoing_offset);
          bVar4 = DTLSMessageBitmap::Range::empty((Range *)&capacity);
          if (bVar4) break;
          sVar7 = Span<unsigned_char>::size((Span<unsigned_char> *)((long)&cbb.u + 0x18));
          sVar9 = CBB_len((CBB *)&sent_record.last_msg_end);
          todo = sVar7 - sVar9;
          if (todo < 0xd) goto LAB_00320d54;
          local_148 = DTLSMessageBitmap::Range::size((Range *)&capacity);
          frag.size_ = todo - 0xc;
          puVar12 = std::min<unsigned_long>(&local_148,&frag.size_);
          local_140 = *puVar12;
          Span<const_unsigned_char>::Span((Span<const_unsigned_char> *)local_160);
          bVar4 = Span<const_unsigned_char>::empty((Span<const_unsigned_char> *)&range.end);
          if (!bVar4) {
            SVar13 = Span<const_unsigned_char>::subspan
                               ((Span<const_unsigned_char> *)&range.end,capacity,local_140);
            frag_start = (size_t)SVar13.data_;
            local_160 = (undefined1  [8])frag_start;
            local_168 = (uchar *)SVar13.size_;
            frag.data_ = local_168;
          }
          child.u._24_8_ = CBB_len((CBB *)&sent_record.last_msg_end);
          iVar6 = CBB_add_u8((CBB *)&sent_record.last_msg_end,body.size_._4_1_);
          if (((iVar6 == 0) ||
              (iVar6 = CBB_add_u24((CBB *)&sent_record.last_msg_end,local_108), iVar6 == 0)) ||
             ((iVar6 = CBB_add_u16((CBB *)&sent_record.last_msg_end,hdr._0_2_), iVar6 == 0 ||
              ((iVar6 = CBB_add_u24((CBB *)&sent_record.last_msg_end,(uint32_t)capacity), iVar6 == 0
               || (iVar6 = CBB_add_u24_length_prefixed
                                     ((CBB *)&sent_record.last_msg_end,(CBB *)&frag_end), iVar6 == 0
                  )))))) {
LAB_00320c48:
            ERR_put_error(0x10,0,0x44,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc"
                          ,0x313);
            return seal_error;
          }
          puVar10 = Span<const_unsigned_char>::data((Span<const_unsigned_char> *)local_160);
          sVar7 = Span<const_unsigned_char>::size((Span<const_unsigned_char> *)local_160);
          iVar6 = CBB_add_bytes((CBB *)&frag_end,puVar10,sVar7);
          if ((iVar6 == 0) || (iVar6 = CBB_flush((CBB *)&sent_record.last_msg_end), iVar6 == 0))
          goto LAB_00320c48;
          local_1b0 = CBB_len((CBB *)&sent_record.last_msg_end);
          local_1d0 = Span<unsigned_char>::subspan
                                ((Span<unsigned_char> *)((long)&cbb.u + 0x18),child.u._24_8_,
                                 local_1b0 - child.u._24_8_);
          Span<unsigned_char_const>::Span<bssl::Span<unsigned_char>,void,bssl::Span<unsigned_char>>
                    (local_1c0,&local_1d0);
          in_00.size_ = in_R9;
          in_00.data_ = local_1b8;
          ssl_do_msg_callback((bssl *)ssl,(SSL *)0x1,0x16,local_1c0._0_4_,in_00);
          uVar2 = local_140;
          ssl->d1->outgoing_offset = (int)capacity + (int)local_140;
          sVar7 = DTLSMessageBitmap::Range::size((Range *)&capacity);
          if (uVar2 < sVar7) goto LAB_00320d54;
        }
        ssl->d1->outgoing_offset = 0;
        ssl->d1->outgoing_written = ssl->d1->outgoing_written + '\x01';
      } while (uVar5 != 0);
      bVar3 = true;
LAB_00320d54:
      sent_record.number.combined_._1_1_ = ssl->d1->outgoing_written;
      sent_record._8_4_ = ssl->d1->outgoing_offset;
      sVar7 = CBB_len((CBB *)&sent_record.last_msg_end);
      if (sVar7 == 0) {
        if (bVar3) {
          __assert_fail("!should_continue",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc"
                        ,0x331,
                        "seal_result_t bssl::seal_next_record(SSL *, Span<uint8_t>, size_t *)");
        }
        out_local.size_._4_4_ = seal_flush;
      }
      else {
        puVar10 = Span<unsigned_char>::data((Span<unsigned_char> *)&ssl_local);
        sVar7 = Span<unsigned_char>::size((Span<unsigned_char> *)&ssl_local);
        in = CBB_data((CBB *)&sent_record.last_msg_end);
        sVar9 = CBB_len((CBB *)&sent_record.last_msg_end);
        bVar4 = dtls_seal_record(ssl,(DTLSRecordNumber *)&msg,puVar10,out_len,sVar7,'\x16',in,sVar9,
                                 pDVar8->epoch);
        if (bVar4) {
          if ((ssl->s3->version == 0) || (uVar5 = ssl_protocol_version(ssl), 0x303 < uVar5)) {
            bVar4 = std::operator==(&ssl->d1->sent_records,(nullptr_t)0x0);
            if (bVar4) {
              MakeUnique<bssl::MRUQueue<bssl::DTLSSentRecord,32ul>>();
              std::unique_ptr<bssl::MRUQueue<bssl::DTLSSentRecord,_32UL>,_bssl::internal::Deleter>::
              operator=(&ssl->d1->sent_records,&local_1d8);
              std::unique_ptr<bssl::MRUQueue<bssl::DTLSSentRecord,_32UL>,_bssl::internal::Deleter>::
              ~unique_ptr(&local_1d8);
              bVar4 = std::operator==(&ssl->d1->sent_records,(nullptr_t)0x0);
              if (bVar4) {
                return seal_error;
              }
            }
            this = std::
                   unique_ptr<bssl::MRUQueue<bssl::DTLSSentRecord,_32UL>,_bssl::internal::Deleter>::
                   operator->(&ssl->d1->sent_records);
            t.last_msg = sent_record.number.combined_._1_1_;
            t.first_msg = (uint8_t)sent_record.number.combined_;
            t._10_2_ = sent_record.number.combined_._2_2_;
            t.first_msg_start = sent_record.number.combined_._4_4_;
            t.number.combined_ = (uint64_t)msg;
            t.last_msg_end._0_2_ = sent_record._8_2_;
            t.last_msg_end._2_2_ = sent_record._10_2_;
            t._20_4_ = sent_record.first_msg_start;
            MRUQueue<bssl::DTLSSentRecord,_32UL>::PushBack(this,t);
          }
          out_local.size_._4_4_ = seal_flush;
          if (bVar3) {
            out_local.size_._4_4_ = seal_continue;
          }
        }
        else {
          out_local.size_._4_4_ = seal_error;
        }
      }
    }
    else {
      DTLSRecordNumber::DTLSRecordNumber(&local_50);
      puVar10 = Span<unsigned_char>::data((Span<unsigned_char> *)&ssl_local);
      sVar7 = Span<unsigned_char>::size((Span<unsigned_char> *)&ssl_local);
      sVar9 = 0x14;
      bVar3 = dtls_seal_record(ssl,&local_50,puVar10,out_len,sVar7,'\x14',"\x01",1,pDVar8->epoch);
      if (bVar3) {
        Span<unsigned_char_const>::Span<1ul>
                  ((Span<unsigned_char_const> *)&iStack_60,(uchar (*) [1])"\x01");
        SVar13.size_ = sVar9;
        SVar13.data_ = local_58;
        ssl_do_msg_callback((bssl *)ssl,(SSL *)0x1,0x14,iStack_60,SVar13);
        ssl->d1->outgoing_offset = 0;
        ssl->d1->outgoing_written = ssl->d1->outgoing_written + '\x01';
        out_local.size_._4_4_ = seal_continue;
      }
      else {
        out_local.size_._4_4_ = seal_error;
      }
    }
  }
  else {
    out_local.size_._4_4_ = seal_flush;
  }
  return out_local.size_._4_4_;
}

Assistant:

static seal_result_t seal_next_record(SSL *ssl, Span<uint8_t> out,
                                      size_t *out_len) {
  *out_len = 0;

  // Skip any fully acked messages.
  while (ssl->d1->outgoing_written < ssl->d1->outgoing_messages.size() &&
         ssl->d1->outgoing_messages[ssl->d1->outgoing_written].IsFullyAcked()) {
    ssl->d1->outgoing_offset = 0;
    ssl->d1->outgoing_written++;
  }

  // There was nothing left to write.
  if (ssl->d1->outgoing_written >= ssl->d1->outgoing_messages.size()) {
    return seal_flush;
  }

  const auto &first_msg = ssl->d1->outgoing_messages[ssl->d1->outgoing_written];
  size_t prefix_len = dtls_seal_prefix_len(ssl, first_msg.epoch);
  size_t max_in_len = dtls_seal_max_input_len(ssl, first_msg.epoch, out.size());
  if (max_in_len == 0) {
    // There is no room for a single record.
    return seal_flush;
  }

  if (first_msg.is_ccs) {
    static const uint8_t kChangeCipherSpec[1] = {SSL3_MT_CCS};
    DTLSRecordNumber record_number;
    if (!dtls_seal_record(ssl, &record_number, out.data(), out_len, out.size(),
                          SSL3_RT_CHANGE_CIPHER_SPEC, kChangeCipherSpec,
                          sizeof(kChangeCipherSpec), first_msg.epoch)) {
      return seal_error;
    }

    ssl_do_msg_callback(ssl, /*is_write=*/1, SSL3_RT_CHANGE_CIPHER_SPEC,
                        kChangeCipherSpec);
    ssl->d1->outgoing_offset = 0;
    ssl->d1->outgoing_written++;
    return seal_continue;
  }

  // TODO(crbug.com/374991962): For now, only send one message per record in
  // epoch 0. Sending multiple is allowed and more efficient, but breaks
  // b/378742138.
  const bool allow_multiple_messages = first_msg.epoch != 0;

  // Pack as many handshake fragments into one record as we can. We stage the
  // fragments in the output buffer, to be sealed in-place.
  bool should_continue = false;
  Span<uint8_t> fragments = out.subspan(prefix_len, max_in_len);
  CBB cbb;
  CBB_init_fixed(&cbb, fragments.data(), fragments.size());
  DTLSSentRecord sent_record;
  sent_record.first_msg = ssl->d1->outgoing_written;
  sent_record.first_msg_start = ssl->d1->outgoing_offset;
  while (ssl->d1->outgoing_written < ssl->d1->outgoing_messages.size()) {
    const auto &msg = ssl->d1->outgoing_messages[ssl->d1->outgoing_written];
    if (msg.epoch != first_msg.epoch || msg.is_ccs) {
      // We can only pack messages if the epoch matches. There may be more room
      // in the packet, so tell the caller to keep going.
      should_continue = true;
      break;
    }

    // Decode |msg|'s header.
    CBS cbs(msg.data), body_cbs;
    struct hm_header_st hdr;
    if (!dtls1_parse_fragment(&cbs, &hdr, &body_cbs) ||  //
        hdr.frag_off != 0 ||                             //
        hdr.frag_len != CBS_len(&body_cbs) ||            //
        hdr.msg_len != CBS_len(&body_cbs) ||             //
        CBS_len(&cbs) != 0) {
      OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
      return seal_error;
    }

    // Iterate over every un-acked range in the message, if any.
    Span<const uint8_t> body = body_cbs;
    for (;;) {
      auto range = msg.acked.NextUnmarkedRange(ssl->d1->outgoing_offset);
      if (range.empty()) {
        // Advance to the next message.
        ssl->d1->outgoing_offset = 0;
        ssl->d1->outgoing_written++;
        break;
      }

      // Determine how much progress can be made (minimum one byte of progress).
      size_t capacity = fragments.size() - CBB_len(&cbb);
      if (capacity < DTLS1_HM_HEADER_LENGTH + 1) {
        goto packet_full;
      }
      size_t todo = std::min(range.size(), capacity - DTLS1_HM_HEADER_LENGTH);

      // Empty messages are special-cased in ACK tracking. We act as if they
      // have one byte, but in reality that byte is tracking the header.
      Span<const uint8_t> frag;
      if (!body.empty()) {
        frag = body.subspan(range.start, todo);
      }

      // Assemble the fragment.
      size_t frag_start = CBB_len(&cbb);
      CBB child;
      if (!CBB_add_u8(&cbb, hdr.type) ||                       //
          !CBB_add_u24(&cbb, hdr.msg_len) ||                   //
          !CBB_add_u16(&cbb, hdr.seq) ||                       //
          !CBB_add_u24(&cbb, range.start) ||                   //
          !CBB_add_u24_length_prefixed(&cbb, &child) ||        //
          !CBB_add_bytes(&child, frag.data(), frag.size()) ||  //
          !CBB_flush(&cbb)) {
        OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
        return seal_error;
      }
      size_t frag_end = CBB_len(&cbb);

      // TODO(davidben): It is odd that, on output, we inform the caller of
      // retransmits and individual fragments, but on input we only inform the
      // caller of complete messages.
      ssl_do_msg_callback(ssl, /*is_write=*/1, SSL3_RT_HANDSHAKE,
                          fragments.subspan(frag_start, frag_end - frag_start));

      ssl->d1->outgoing_offset = range.start + todo;
      if (todo < range.size()) {
        // The packet was the limiting factor.
        goto packet_full;
      }
    }

    if (!allow_multiple_messages) {
      should_continue = true;
      break;
    }
  }

packet_full:
  sent_record.last_msg = ssl->d1->outgoing_written;
  sent_record.last_msg_end = ssl->d1->outgoing_offset;

  // We could not fit anything. Don't try to make a record.
  if (CBB_len(&cbb) == 0) {
    assert(!should_continue);
    return seal_flush;
  }

  if (!dtls_seal_record(ssl, &sent_record.number, out.data(), out_len,
                        out.size(), SSL3_RT_HANDSHAKE, CBB_data(&cbb),
                        CBB_len(&cbb), first_msg.epoch)) {
    return seal_error;
  }

  // If DTLS 1.3 (or if the version is not yet known and it may be DTLS 1.3),
  // save the record number to match against ACKs later.
  if (ssl->s3->version == 0 || ssl_protocol_version(ssl) >= TLS1_3_VERSION) {
    if (ssl->d1->sent_records == nullptr) {
      ssl->d1->sent_records =
          MakeUnique<MRUQueue<DTLSSentRecord, DTLS_MAX_ACK_BUFFER>>();
      if (ssl->d1->sent_records == nullptr) {
        return seal_error;
      }
    }
    ssl->d1->sent_records->PushBack(sent_record);
  }

  return should_continue ? seal_continue : seal_flush;
}